

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall spvtools::opt::analysis::Opaque::~Opaque(Opaque *this)

{
  Opaque *this_local;
  
  ~Opaque(this);
  ::operator_delete(this,0x48);
  return;
}

Assistant:

Opaque(const Opaque&) = default;